

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SampleScene.h
# Opt level: O3

void __thiscall
SampleScene<unsigned_int,_ColorShader,_TextureShader,_myTexture>::SampleScene
          (SampleScene<unsigned_int,_ColorShader,_TextureShader,_myTexture> *this,myTexture *texture
          )

{
  SimpleMesh<SimpleVertex> *this_00;
  vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_> *__x;
  Scene<unsigned_int> *this_01;
  void *pvVar1;
  long lVar2;
  initializer_list<SimpleVertex> __l;
  initializer_list<std::array<int,_3UL>_> __l_00;
  initializer_list<SimpleVertex> __l_01;
  initializer_list<std::array<int,_3UL>_> __l_02;
  initializer_list<TextureVertex> __l_03;
  initializer_list<std::array<int,_3UL>_> __l_04;
  initializer_list<SimpleMesh<SimpleVertex>_> __l_05;
  initializer_list<SimpleMesh<TextureVertex>_> __l_06;
  initializer_list<SimpleMesh<SimpleVertex>_> __l_07;
  allocator_type local_4da;
  allocator_type local_4d9;
  Vector3 local_4d8;
  vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_> local_4c0;
  SimpleMesh<TextureVertex> *local_4a8;
  SimpleMesh<SimpleVertex> *local_4a0;
  Vector3 local_498 [5];
  long alStack_420 [6];
  undefined1 local_3f0 [40];
  undefined1 local_3c8 [24];
  undefined1 local_3b0 [16];
  undefined1 local_3a0 [40];
  undefined1 local_378 [40];
  undefined1 local_350 [40];
  undefined1 local_328 [40];
  undefined1 local_300 [40];
  TextureVertex local_2d8;
  TextureVertex local_2b0;
  TextureVertex local_288;
  TextureVertex local_260;
  TextureVertex local_238;
  TextureVertex local_210;
  TextureVertex local_1e8;
  TextureVertex local_1c0;
  TextureVertex local_198;
  TextureVertex local_170;
  TextureVertex local_148;
  TextureVertex local_120;
  TextureVertex local_f8;
  TextureVertex local_d0;
  TextureVertex local_a8;
  TextureVertex local_80;
  TextureVertex local_58;
  
  SimpleVertex::SimpleVertex((SimpleVertex *)local_3f0,1.0,1.0,-1.0,0xff0000);
  SimpleVertex::SimpleVertex((SimpleVertex *)(local_3f0 + 0x20),1.0,-1.0,-1.0,0xffff00);
  SimpleVertex::SimpleVertex((SimpleVertex *)local_3b0,1.0,1.0,1.0,0xff00ff);
  SimpleVertex::SimpleVertex((SimpleVertex *)(local_3a0 + 0x10),1.0,-1.0,1.0,0xff);
  SimpleVertex::SimpleVertex((SimpleVertex *)(local_378 + 8),-1.0,1.0,-1.0,0xffff);
  SimpleVertex::SimpleVertex((SimpleVertex *)local_350,-1.0,-1.0,-1.0,0xff00);
  SimpleVertex::SimpleVertex((SimpleVertex *)(local_350 + 0x20),-1.0,1.0,1.0,0x80ff00);
  SimpleVertex::SimpleVertex((SimpleVertex *)(local_328 + 0x18),-1.0,-1.0,1.0,0x808080);
  __l._M_len = 8;
  __l._M_array = (SimpleVertex *)local_3f0;
  std::vector<SimpleVertex,_std::allocator<SimpleVertex>_>::vector
            ((vector<SimpleVertex,_std::allocator<SimpleVertex>_> *)&local_4d8,__l,&local_4d9);
  memcpy(local_498,&DAT_0010a014,0x90);
  __l_00._M_len = 0xc;
  __l_00._M_array = (iterator)local_498;
  std::vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>::vector
            (&local_4c0,__l_00,&local_4da);
  SimpleMesh<SimpleVertex>::SimpleMesh
            (&this->colorMesh,(vector<SimpleVertex,_std::allocator<SimpleVertex>_> *)&local_4d8,
             &local_4c0);
  if (local_4c0.super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_4c0.
                    super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_4c0.
                          super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_4c0.
                          super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((void *)local_4d8.x != (void *)0x0) {
    operator_delete((void *)local_4d8.x,(long)local_4d8.z - (long)local_4d8.x);
  }
  SimpleVertex::SimpleVertex((SimpleVertex *)local_3f0,1.0,1.0,-1.0,0xff0000);
  SimpleVertex::SimpleVertex((SimpleVertex *)(local_3f0 + 0x20),1.0,-1.0,-1.0,0xffff00);
  SimpleVertex::SimpleVertex((SimpleVertex *)local_3b0,1.0,1.0,1.0,0xff00ff);
  SimpleVertex::SimpleVertex((SimpleVertex *)(local_3a0 + 0x10),1.0,-1.0,1.0,0xff);
  SimpleVertex::SimpleVertex((SimpleVertex *)(local_378 + 8),-1.0,1.0,-1.0,0xffff);
  SimpleVertex::SimpleVertex((SimpleVertex *)local_350,-1.0,-1.0,-1.0,0xff00);
  SimpleVertex::SimpleVertex((SimpleVertex *)(local_350 + 0x20),-1.0,1.0,1.0,0x80ff00);
  SimpleVertex::SimpleVertex((SimpleVertex *)(local_328 + 0x18),-1.0,-1.0,1.0,0x808080);
  SimpleVertex::SimpleVertex((SimpleVertex *)(local_300 + 0x10),0.0,2.0,0.0,0xad0040);
  __l_01._M_len = 9;
  __l_01._M_array = (iterator)local_3f0;
  std::vector<SimpleVertex,_std::allocator<SimpleVertex>_>::vector
            ((vector<SimpleVertex,_std::allocator<SimpleVertex>_> *)&local_4d8,__l_01,&local_4d9);
  memcpy(local_498,&DAT_0010a0a4,0xa8);
  __l_02._M_len = 0xe;
  __l_02._M_array = (iterator)local_498;
  std::vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>::vector
            (&local_4c0,__l_02,&local_4da);
  this_00 = &this->secondColorMesh;
  SimpleMesh<SimpleVertex>::SimpleMesh
            (this_00,(vector<SimpleVertex,_std::allocator<SimpleVertex>_> *)&local_4d8,&local_4c0);
  if (local_4c0.super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_4c0.
                    super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_4c0.
                          super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_4c0.
                          super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((void *)local_4d8.x != (void *)0x0) {
    operator_delete((void *)local_4d8.x,(long)local_4d8.z - (long)local_4d8.x);
  }
  local_4a0 = this_00;
  TextureVertex::TextureVertex((TextureVertex *)local_3f0,0.0,0.0,0.0,0.0,0.0);
  TextureVertex::TextureVertex((TextureVertex *)local_3c8,0.0,0.0,0.0,1.0,1.0);
  TextureVertex::TextureVertex((TextureVertex *)local_3a0,0.0,0.0,0.0,1.0,0.0);
  TextureVertex::TextureVertex((TextureVertex *)local_378,0.0,0.0,1.0,1.0,0.0);
  TextureVertex::TextureVertex((TextureVertex *)local_350,0.0,0.0,1.0,0.0,1.0);
  TextureVertex::TextureVertex((TextureVertex *)local_328,0.0,0.0,1.0,0.0,0.0);
  TextureVertex::TextureVertex((TextureVertex *)local_300,0.0,1.0,0.0,0.0,1.0);
  TextureVertex::TextureVertex(&local_2d8,0.0,1.0,0.0,1.0,1.0);
  TextureVertex::TextureVertex(&local_2b0,0.0,1.0,0.0,1.0,1.0);
  TextureVertex::TextureVertex(&local_288,0.0,1.0,1.0,1.0,1.0);
  TextureVertex::TextureVertex(&local_260,0.0,1.0,1.0,0.0,1.0);
  TextureVertex::TextureVertex(&local_238,0.0,1.0,1.0,0.0,1.0);
  TextureVertex::TextureVertex(&local_210,1.0,0.0,0.0,1.0,0.0);
  TextureVertex::TextureVertex(&local_1e8,1.0,0.0,0.0,0.0,0.0);
  TextureVertex::TextureVertex(&local_1c0,1.0,0.0,0.0,1.0,0.0);
  TextureVertex::TextureVertex(&local_198,1.0,0.0,1.0,0.0,0.0);
  TextureVertex::TextureVertex(&local_170,1.0,0.0,1.0,0.0,0.0);
  TextureVertex::TextureVertex(&local_148,1.0,0.0,1.0,1.0,0.0);
  TextureVertex::TextureVertex(&local_120,1.0,1.0,0.0,0.0,1.0);
  TextureVertex::TextureVertex(&local_f8,1.0,1.0,0.0,1.0,1.0);
  TextureVertex::TextureVertex(&local_d0,1.0,1.0,0.0,1.0,0.0);
  TextureVertex::TextureVertex(&local_a8,1.0,1.0,1.0,0.0,1.0);
  TextureVertex::TextureVertex(&local_80,1.0,1.0,1.0,0.0,0.0);
  TextureVertex::TextureVertex(&local_58,1.0,1.0,1.0,1.0,1.0);
  __l_03._M_len = 0x18;
  __l_03._M_array = (iterator)local_3f0;
  std::vector<TextureVertex,_std::allocator<TextureVertex>_>::vector
            ((vector<TextureVertex,_std::allocator<TextureVertex>_> *)&local_4d8,__l_03,
             (allocator_type *)&local_4d9);
  memcpy(local_498,&DAT_0010a14c,0x90);
  __l_04._M_len = 0xc;
  __l_04._M_array = (iterator)local_498;
  std::vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>::vector
            (&local_4c0,__l_04,&local_4da);
  local_4a8 = &this->textureMesh;
  SimpleMesh<TextureVertex>::SimpleMesh
            (local_4a8,(vector<TextureVertex,_std::allocator<TextureVertex>_> *)&local_4d8,
             &local_4c0);
  if (local_4c0.super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_4c0.
                    super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_4c0.
                          super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_4c0.
                          super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((void *)local_4d8.x != (void *)0x0) {
    operator_delete((void *)local_4d8.x,(long)local_4d8.z - (long)local_4d8.x);
  }
  std::vector<SimpleVertex,_std::allocator<SimpleVertex>_>::vector
            ((vector<SimpleVertex,_std::allocator<SimpleVertex>_> *)local_3f0,
             (vector<SimpleVertex,_std::allocator<SimpleVertex>_> *)this);
  __x = &(this->colorMesh).indices;
  std::vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>::vector
            ((vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_> *)
             (local_3f0 + 0x18),__x);
  std::vector<SimpleVertex,_std::allocator<SimpleVertex>_>::vector
            ((vector<SimpleVertex,_std::allocator<SimpleVertex>_> *)(local_3c8 + 8),
             &this_00->vertices);
  std::vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>::vector
            ((vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_> *)(local_3b0 + 8)
             ,&(this->secondColorMesh).indices);
  __l_05._M_len = 2;
  __l_05._M_array = (iterator)local_3f0;
  std::vector<SimpleMesh<SimpleVertex>,_std::allocator<SimpleMesh<SimpleVertex>_>_>::vector
            ((vector<SimpleMesh<SimpleVertex>,_std::allocator<SimpleMesh<SimpleVertex>_>_> *)
             local_498,__l_05,(allocator_type *)&local_4d8);
  Object<SimpleMesh<SimpleVertex>,_SimpleVertex,_ColorShader,_myTexture>::Object
            (&this->colorCube,
             (vector<SimpleMesh<SimpleVertex>,_std::allocator<SimpleMesh<SimpleVertex>_>_> *)
             local_498,(ColorShader *)&local_4c0,texture);
  std::vector<SimpleMesh<SimpleVertex>,_std::allocator<SimpleMesh<SimpleVertex>_>_>::~vector
            ((vector<SimpleMesh<SimpleVertex>,_std::allocator<SimpleMesh<SimpleVertex>_>_> *)
             local_498);
  lVar2 = 0x60;
  do {
    pvVar1 = *(void **)((long)alStack_420 + lVar2 + 0x18);
    if (pvVar1 != (void *)0x0) {
      operator_delete(pvVar1,*(long *)((long)alStack_420 + lVar2 + 0x28) - (long)pvVar1);
    }
    pvVar1 = *(void **)((long)alStack_420 + lVar2);
    if (pvVar1 != (void *)0x0) {
      operator_delete(pvVar1,*(long *)((long)alStack_420 + lVar2 + 0x10) - (long)pvVar1);
    }
    lVar2 = lVar2 + -0x30;
  } while (lVar2 != 0);
  std::vector<TextureVertex,_std::allocator<TextureVertex>_>::vector
            ((vector<TextureVertex,_std::allocator<TextureVertex>_> *)local_3f0,&local_4a8->vertices
            );
  std::vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>::vector
            ((vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_> *)
             (local_3f0 + 0x18),&(this->textureMesh).indices);
  __l_06._M_len = 1;
  __l_06._M_array = (iterator)local_3f0;
  std::vector<SimpleMesh<TextureVertex>,_std::allocator<SimpleMesh<TextureVertex>_>_>::vector
            ((vector<SimpleMesh<TextureVertex>,_std::allocator<SimpleMesh<TextureVertex>_>_> *)
             local_498,__l_06,(allocator_type *)&local_4d8);
  Object<SimpleMesh<TextureVertex>,_TextureVertex,_TextureShader,_myTexture>::Object
            (&this->textureCube,
             (vector<SimpleMesh<TextureVertex>,_std::allocator<SimpleMesh<TextureVertex>_>_> *)
             local_498,(TextureShader *)&local_4c0,texture);
  std::vector<SimpleMesh<TextureVertex>,_std::allocator<SimpleMesh<TextureVertex>_>_>::~vector
            ((vector<SimpleMesh<TextureVertex>,_std::allocator<SimpleMesh<TextureVertex>_>_> *)
             local_498);
  if ((pointer)local_3f0._24_8_ != (pointer)0x0) {
    operator_delete((void *)local_3f0._24_8_,local_3c8._0_8_ - local_3f0._24_8_);
  }
  if ((pointer)local_3f0._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_3f0._0_8_,local_3f0._16_8_ - local_3f0._0_8_);
  }
  std::vector<SimpleVertex,_std::allocator<SimpleVertex>_>::vector
            ((vector<SimpleVertex,_std::allocator<SimpleVertex>_> *)local_3f0,
             (vector<SimpleVertex,_std::allocator<SimpleVertex>_> *)this);
  std::vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>::vector
            ((vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_> *)
             (local_3f0 + 0x18),__x);
  __l_07._M_len = 1;
  __l_07._M_array = (iterator)local_3f0;
  std::vector<SimpleMesh<SimpleVertex>,_std::allocator<SimpleMesh<SimpleVertex>_>_>::vector
            ((vector<SimpleMesh<SimpleVertex>,_std::allocator<SimpleMesh<SimpleVertex>_>_> *)
             local_498,__l_07,(allocator_type *)&local_4d8);
  Object<SimpleMesh<SimpleVertex>,_SimpleVertex,_ColorShader,_myTexture>::Object
            (&this->anotherColorCube,
             (vector<SimpleMesh<SimpleVertex>,_std::allocator<SimpleMesh<SimpleVertex>_>_> *)
             local_498,(ColorShader *)&local_4c0,texture);
  std::vector<SimpleMesh<SimpleVertex>,_std::allocator<SimpleMesh<SimpleVertex>_>_>::~vector
            ((vector<SimpleMesh<SimpleVertex>,_std::allocator<SimpleMesh<SimpleVertex>_>_> *)
             local_498);
  if ((pointer)local_3f0._24_8_ != (pointer)0x0) {
    operator_delete((void *)local_3f0._24_8_,local_3c8._0_8_ - local_3f0._24_8_);
  }
  if ((pointer)local_3f0._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_3f0._0_8_,local_3f0._16_8_ - local_3f0._0_8_);
  }
  Vector3::Vector3((Vector3 *)local_3f0,0.0,0.0,0.0);
  Vector3::Vector3(local_498,0.0,0.0,-3.5);
  Vector3::Vector3(&local_4d8,0.0,1.0,0.0);
  Camera::Camera(&this->camera,45.0,0.1,10.0,(Vector3 *)local_3f0,local_498,&local_4d8);
  this_01 = &this->scene;
  memcpy(this_01,&this->camera,0x98);
  (this->scene).pipelines.
  super__Vector_base<std::unique_ptr<DedicatedPipeline<unsigned_int>,_std::default_delete<DedicatedPipeline<unsigned_int>_>_>,_std::allocator<std::unique_ptr<DedicatedPipeline<unsigned_int>,_std::default_delete<DedicatedPipeline<unsigned_int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->scene).pipelines.
  super__Vector_base<std::unique_ptr<DedicatedPipeline<unsigned_int>,_std::default_delete<DedicatedPipeline<unsigned_int>_>_>,_std::allocator<std::unique_ptr<DedicatedPipeline<unsigned_int>,_std::default_delete<DedicatedPipeline<unsigned_int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->scene).pipelines.
  super__Vector_base<std::unique_ptr<DedicatedPipeline<unsigned_int>,_std::default_delete<DedicatedPipeline<unsigned_int>_>_>,_std::allocator<std::unique_ptr<DedicatedPipeline<unsigned_int>,_std::default_delete<DedicatedPipeline<unsigned_int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ObjectInfo::setPosition((this->colorCube).info,-1.0,0.0,-3.0);
  ObjectInfo::setScale((this->colorCube).info,0.5,0.5,0.5);
  ObjectInfo::setPosition((this->textureCube).info,1.0,0.0,-3.0);
  ObjectInfo::setPosition((this->anotherColorCube).info,-5.0,0.0,-8.0);
  ObjectInfo::setScale((this->anotherColorCube).info,1.0,0.5,1.0);
  Scene<unsigned_int>::add<SimpleMesh<SimpleVertex>,SimpleVertex,ColorShader,myTexture>
            (this_01,&this->colorCube);
  Scene<unsigned_int>::add<SimpleMesh<TextureVertex>,TextureVertex,TextureShader,myTexture>
            (this_01,&this->textureCube);
  Scene<unsigned_int>::add<SimpleMesh<SimpleVertex>,SimpleVertex,ColorShader,myTexture>
            (this_01,&this->anotherColorCube);
  return;
}

Assistant:

explicit SampleScene(Texture &...texture) : colorCube({colorMesh,secondColorMesh}, FirstShader(), texture...),
                                                textureCube({textureMesh}, SecondShader(), texture...),
                                                anotherColorCube({colorMesh}, FirstShader(), texture...),
                                                camera(45.0, 0.1, 10, {0, 0, 0}, {0, 0, -3.5}),
                                                scene(camera) {

        // Sets position and scale of the cubes
        colorCube.setPosition(-1, 0, -3);
        colorCube.setScale(.5, .5, .5);
        textureCube.setPosition(1, 0, -3);
        anotherColorCube.setPosition(-5, 0, -8);
        anotherColorCube.setScale(1, .5, 1);

        // Adds the cubes to the scene
        scene.add(colorCube);
        scene.add(textureCube);
        scene.add(anotherColorCube);
    }